

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdockwidget.cpp
# Opt level: O2

void QDockWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *title;
  DockWidgetArea *pDVar1;
  undefined8 uVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  DockWidgetArea DVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        featuresChanged((QDockWidget *)_o,
                        (QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>)
                        ((QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> *)_a[1])->
                        super_QFlagsStorage<QDockWidget::DockWidgetFeature>);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        topLevelChanged((QDockWidget *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        allowedAreasChanged((QDockWidget *)_o,
                            (QFlagsStorageHelper<Qt::DockWidgetArea,_4>)
                            ((QFlagsStorageHelper<Qt::DockWidgetArea,_4> *)_a[1])->
                            super_QFlagsStorage<Qt::DockWidgetArea>);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        visibilityChanged((QDockWidget *)_o,*_a[1]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        dockLocationChanged((QDockWidget *)_o,*_a[1]);
        return;
      }
      break;
    default:
      goto switchD_003d8126_caseD_3;
    }
    goto LAB_003d8439;
  case ReadProperty:
    if (4 < (uint)_id) break;
    pDVar1 = (DockWidgetArea *)*_a;
    switch(_id) {
    case 0:
      *(undefined1 *)pDVar1 = *(byte *)(*(long *)(_o + 0x20) + 0xc) & LeftDockWidgetArea;
      goto switchD_003d8126_caseD_3;
    case 1:
      DVar6 = *(DockWidgetArea *)(*(long *)(_o + 8) + 0x260);
      break;
    case 2:
      DVar6 = *(DockWidgetArea *)(*(long *)(_o + 8) + 0x264);
      break;
    case 3:
      QWidget::windowTitle((QString *)&local_38,(QWidget *)_o);
      pDVar3 = *(Data **)pDVar1;
      pcVar4 = *(char16_t **)(pDVar1 + 2);
      *(Data **)pDVar1 = local_38.d;
      *(char16_t **)(pDVar1 + 2) = local_38.ptr;
      uVar2 = *(undefined8 *)(pDVar1 + 4);
      *(qsizetype *)(pDVar1 + 4) = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = uVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      goto switchD_003d8126_caseD_3;
    case 4:
      DVar6 = dockLocation((QDockWidget *)_o);
    }
    *pDVar1 = DVar6;
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      title = (QString *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFloating((QDockWidget *)_o,*(bool *)&(title->d).d);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFeatures((QDockWidget *)_o,
                      (QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>)
                      *(QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> *)&(title->d).d);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setAllowedAreas((QDockWidget *)_o,
                          (QFlagsStorageHelper<Qt::DockWidgetArea,_4>)
                          *(QFlagsStorageHelper<Qt::DockWidgetArea,_4> *)&(title->d).d);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QWidget::setWindowTitle((QWidget *)_o,title);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDockLocation((QDockWidget *)_o,*(DockWidgetArea *)&(title->d).d);
          return;
        }
      }
      goto LAB_003d8439;
    }
    break;
  case IndexOfMethod:
    bVar5 = QtMocHelpers::
            indexOfMethod<void(QDockWidget::*)(QFlags<QDockWidget::DockWidgetFeature>)>
                      ((QtMocHelpers *)_a,(void **)featuresChanged,0,0);
    if ((((!bVar5) &&
         (bVar5 = QtMocHelpers::indexOfMethod<void(QDockWidget::*)(bool)>
                            ((QtMocHelpers *)_a,(void **)topLevelChanged,0,1), !bVar5)) &&
        (bVar5 = QtMocHelpers::indexOfMethod<void(QDockWidget::*)(QFlags<Qt::DockWidgetArea>)>
                           ((QtMocHelpers *)_a,(void **)allowedAreasChanged,0,2), !bVar5)) &&
       (bVar5 = QtMocHelpers::indexOfMethod<void(QDockWidget::*)(bool)>
                          ((QtMocHelpers *)_a,(void **)visibilityChanged,0,3), !bVar5)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QDockWidget::*)(Qt::DockWidgetArea)>
                  ((QtMocHelpers *)_a,(void **)dockLocationChanged,0,4);
        return;
      }
      goto LAB_003d8439;
    }
  }
switchD_003d8126_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003d8439:
  __stack_chk_fail();
}

Assistant:

void QDockWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDockWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->featuresChanged((*reinterpret_cast< std::add_pointer_t<QDockWidget::DockWidgetFeatures>>(_a[1]))); break;
        case 1: _t->topLevelChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->allowedAreasChanged((*reinterpret_cast< std::add_pointer_t<Qt::DockWidgetAreas>>(_a[1]))); break;
        case 3: _t->visibilityChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->dockLocationChanged((*reinterpret_cast< std::add_pointer_t<Qt::DockWidgetArea>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(QDockWidget::DockWidgetFeatures )>(_a, &QDockWidget::featuresChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(bool )>(_a, &QDockWidget::topLevelChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(Qt::DockWidgetAreas )>(_a, &QDockWidget::allowedAreasChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(bool )>(_a, &QDockWidget::visibilityChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(Qt::DockWidgetArea )>(_a, &QDockWidget::dockLocationChanged, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isFloating(); break;
        case 1: QtMocHelpers::assignFlags<DockWidgetFeatures>(_v, _t->features()); break;
        case 2: *reinterpret_cast<Qt::DockWidgetAreas*>(_v) = _t->allowedAreas(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 4: *reinterpret_cast<Qt::DockWidgetArea*>(_v) = _t->dockLocation(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFloating(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setFeatures(*reinterpret_cast<DockWidgetFeatures*>(_v)); break;
        case 2: _t->setAllowedAreas(*reinterpret_cast<Qt::DockWidgetAreas*>(_v)); break;
        case 3: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 4: _t->setDockLocation(*reinterpret_cast<Qt::DockWidgetArea*>(_v)); break;
        default: break;
        }
    }
}